

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::copyUniformData
               (UniformLayout *dstLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *dstBlockPointers,UniformLayout *srcLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *srcBlockPointers)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  DataType DVar4;
  _Base_ptr p_Var5;
  long lVar6;
  pointer pUVar7;
  pointer pUVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  _Rb_tree_header *p_Var15;
  _Base_ptr p_Var16;
  int iVar17;
  _Rb_tree_header *p_Var18;
  int *piVar19;
  pointer pBVar20;
  ulong uVar21;
  void *__dest;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  void *__src;
  long local_78;
  
  uVar9 = (uint)((ulong)((long)(srcLayout->blocks).
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(srcLayout->blocks).
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar9) {
    p_Var1 = &(srcBlockPointers->_M_t)._M_impl.super__Rb_tree_header;
    p_Var15 = &(dstBlockPointers->_M_t)._M_impl.super__Rb_tree_header;
    uVar21 = 0;
    do {
      p_Var5 = (srcBlockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[(long)(int)*(size_t *)(p_Var5 + 1) < (long)uVar21]) {
        if ((long)uVar21 <= (long)(int)*(size_t *)(p_Var5 + 1)) {
          p_Var16 = p_Var5;
        }
      }
      p_Var18 = p_Var1;
      if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
         (p_Var18 = (_Rb_tree_header *)p_Var16,
         (long)uVar21 < (long)(int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
        p_Var18 = p_Var1;
      }
      pBVar20 = (srcLayout->blocks).
                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar21;
      lVar6 = *(long *)(p_Var18 + 1);
      iVar10 = UniformLayout::getBlockIndex(dstLayout,(pBVar20->name)._M_dataplus._M_p);
      if (iVar10 < 0) {
        local_78 = 0;
      }
      else {
        p_Var5 = (dstBlockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 = &p_Var15->_M_header;
        for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
            p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < iVar10]) {
          if (iVar10 <= (int)*(size_t *)(p_Var5 + 1)) {
            p_Var16 = p_Var5;
          }
        }
        p_Var18 = p_Var15;
        if (((_Rb_tree_header *)p_Var16 != p_Var15) &&
           (p_Var18 = (_Rb_tree_header *)p_Var16,
           iVar10 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
          p_Var18 = p_Var15;
        }
        local_78 = *(long *)(p_Var18 + 1);
      }
      if (-1 < iVar10) {
        for (piVar19 = *(int **)&(pBVar20->activeUniformIndices).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar19 !=
            *(pointer *)
             ((long)&(pBVar20->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_> +
             8); piVar19 = piVar19 + 1) {
          iVar10 = *piVar19;
          pUVar7 = (srcLayout->uniforms).
                   super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = UniformLayout::getUniformIndex(dstLayout,pUVar7[iVar10].name._M_dataplus._M_p);
          if (-1 < (int)uVar11) {
            pUVar8 = (dstLayout->uniforms).
                     super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar2 = pUVar8[uVar11].offset;
            iVar3 = pUVar7[iVar10].offset;
            iVar12 = glu::getDataTypeScalarSize(pUVar8[uVar11].type);
            DVar4 = pUVar8[uVar11].type;
            if (0 < pUVar8[uVar11].size) {
              iVar26 = 0;
              do {
                __dest = (void *)(local_78 +
                                 (long)(pUVar8[uVar11].arrayStride * iVar26) + (long)iVar2);
                __src = (void *)(lVar6 + (long)(pUVar7[iVar10].arrayStride * iVar26) + (long)iVar3);
                if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
                  iVar13 = glu::getDataTypeMatrixNumRows(pUVar8[uVar11].type);
                  iVar14 = glu::getDataTypeMatrixNumColumns(pUVar8[uVar11].type);
                  if (0 < iVar14) {
                    iVar17 = 0;
                    do {
                      if (0 < iVar13) {
                        iVar22 = 0;
                        iVar23 = 0;
                        do {
                          if (pUVar8[uVar11].isRowMajor == true) {
                            iVar24 = pUVar8[uVar11].matrixStride * iVar23 + iVar17 * 4;
                          }
                          else {
                            iVar24 = pUVar8[uVar11].matrixStride * iVar17 + iVar22;
                          }
                          if (pUVar7[iVar10].isRowMajor == true) {
                            iVar25 = pUVar7[iVar10].matrixStride * iVar23 + iVar17 * 4;
                          }
                          else {
                            iVar25 = pUVar7[iVar10].matrixStride * iVar17 + iVar22;
                          }
                          *(undefined4 *)((long)__dest + (long)iVar24) =
                               *(undefined4 *)((long)__src + (long)iVar25);
                          iVar23 = iVar23 + 1;
                          iVar22 = iVar22 + 4;
                        } while (iVar13 != iVar23);
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 != iVar14);
                  }
                }
                else {
                  memcpy(__dest,__src,(long)(iVar12 << 2));
                }
                iVar26 = iVar26 + 1;
              } while (iVar26 < pUVar8[uVar11].size);
            }
          }
        }
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uVar9 & 0x7fffffff));
  }
  return;
}

Assistant:

void copyUniformData (const UniformLayout& dstLayout, const std::map<int, void*>& dstBlockPointers, const UniformLayout& srcLayout, const std::map<int, void*>& srcBlockPointers)
{
	// \note Src layout is used as reference in case of activeUniforms happens to be incorrect in dstLayout blocks.
	int numBlocks = (int)srcLayout.blocks.size();

	for (int srcBlockNdx = 0; srcBlockNdx < numBlocks; srcBlockNdx++)
	{
		const BlockLayoutEntry&		srcBlock	= srcLayout.blocks[srcBlockNdx];
		const void*					srcBlockPtr	= srcBlockPointers.find(srcBlockNdx)->second;
		int							dstBlockNdx	= dstLayout.getBlockIndex(srcBlock.name.c_str());
		void*						dstBlockPtr	= dstBlockNdx >= 0 ? dstBlockPointers.find(dstBlockNdx)->second : DE_NULL;

		if (dstBlockNdx < 0)
			continue;

		for (vector<int>::const_iterator srcUniformNdxIter = srcBlock.activeUniformIndices.begin(); srcUniformNdxIter != srcBlock.activeUniformIndices.end(); srcUniformNdxIter++)
		{
			const UniformLayoutEntry&	srcEntry		= srcLayout.uniforms[*srcUniformNdxIter];
			int							dstUniformNdx	= dstLayout.getUniformIndex(srcEntry.name.c_str());

			if (dstUniformNdx < 0)
				continue;

			copyUniformData(dstLayout.uniforms[dstUniformNdx], dstBlockPtr, srcEntry, srcBlockPtr);
		}
	}
}